

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

bool __thiscall
cli::Parser::CmdFunction<bool>::parse(CmdFunction<bool> *this,ostream *output,ostream *error)

{
  bool bVar1;
  undefined1 local_40 [8];
  CallbackArgs args;
  ostream *error_local;
  ostream *output_local;
  CmdFunction<bool> *this_local;
  
  local_40 = (undefined1  [8])&(this->super_CmdBase).arguments;
  args.arguments =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)output;
  args.output = error;
  args.error = error;
  bVar1 = std::function<bool_(cli::CallbackArgs_&)>::operator()
                    (&this->callback,(CallbackArgs *)local_40);
  this->value = bVar1;
  return true;
}

Assistant:

virtual bool parse(std::ostream& output, std::ostream& error) {
				try {
					CallbackArgs args { arguments, output, error };
					value = callback(args);
					return true;
				} catch (...) {
					return false;
				}
			}